

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool cmFileCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  string_view key;
  initializer_list<std::pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
  init;
  allocator<char> local_4c9;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_4c8;
  undefined8 local_4b0;
  char *local_4a8;
  code *local_4a0;
  undefined8 local_498;
  char *local_490;
  code *local_488;
  undefined8 local_480;
  char *local_478;
  code *local_470;
  undefined8 local_468;
  char *local_460;
  code *local_458;
  undefined8 local_450;
  char *local_448;
  code *local_440;
  undefined8 local_438;
  char *local_430;
  code *local_428;
  undefined8 local_420;
  char *local_418;
  code *local_410;
  undefined8 local_408;
  char *local_400;
  code *local_3f8;
  undefined8 local_3f0;
  char *local_3e8;
  code *local_3e0;
  undefined8 local_3d8;
  char *local_3d0;
  code *local_3c8;
  undefined8 local_3c0;
  char *local_3b8;
  code *local_3b0;
  undefined8 local_3a8;
  char *local_3a0;
  code *local_398;
  undefined8 local_390;
  char *local_388;
  code *local_380;
  undefined8 local_378;
  char *local_370;
  code *local_368;
  undefined8 local_360;
  char *local_358;
  code *local_350;
  undefined8 local_348;
  char *local_340;
  code *local_338;
  undefined8 local_330;
  char *local_328;
  code *local_320;
  undefined8 local_318;
  char *local_310;
  code *local_308;
  undefined8 local_300;
  char *local_2f8;
  code *local_2f0;
  undefined8 local_2e8;
  char *local_2e0;
  code *local_2d8;
  undefined8 local_2d0;
  char *local_2c8;
  code *local_2c0;
  undefined8 local_2b8;
  char *local_2b0;
  code *local_2a8;
  undefined8 local_2a0;
  char *local_298;
  code *local_290;
  undefined8 local_288;
  char *local_280;
  code *local_278;
  undefined8 local_270;
  char *local_268;
  code *local_260;
  undefined8 local_258;
  char *local_250;
  code *local_248;
  undefined8 local_240;
  char *local_238;
  code *local_230;
  undefined8 local_228;
  char *local_220;
  code *local_218;
  undefined8 local_210;
  char *local_208;
  code *local_200;
  undefined8 local_1f8;
  char *local_1f0;
  code *local_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  code *local_1d0;
  undefined8 local_1c8;
  char *local_1c0;
  code *local_1b8;
  undefined8 local_1b0;
  char *local_1a8;
  code *local_1a0;
  undefined8 local_198;
  char *local_190;
  code *local_188;
  undefined8 local_180;
  char *local_178;
  code *local_170;
  undefined8 local_168;
  char *local_160;
  code *local_158;
  undefined8 local_150;
  char *local_148;
  code *local_140;
  undefined8 local_138;
  char *local_130;
  code *local_128;
  undefined8 local_120;
  char *local_118;
  code *local_110;
  undefined8 local_108;
  char *local_100;
  code *local_f8;
  undefined8 local_f0;
  char *local_e8;
  code *local_e0;
  undefined8 local_d8;
  char *local_d0;
  code *local_c8;
  undefined8 local_c0;
  char *local_b8;
  code *local_b0;
  undefined8 local_a8;
  char *local_a0;
  code *local_98;
  undefined8 local_90;
  char *local_88;
  code *local_80;
  undefined8 local_78;
  char *local_70;
  code *local_68;
  undefined8 local_60;
  char *local_58;
  code *local_50;
  undefined8 local_48;
  char *local_40;
  code *local_38;
  undefined8 local_30;
  char *local_28;
  code *local_20;
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c8,"must be called with at least two arguments.",&local_4c9);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_4c8);
    bVar2 = false;
  }
  else {
    if (cmFileCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::subcommand == '\0') {
      iVar3 = __cxa_guard_acquire(&cmFileCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::subcommand);
      if (iVar3 != 0) {
        local_4c8.first.super_string_view._M_len = 5;
        local_4c8.first.super_string_view._M_str = "WRITE";
        local_4c8.second = anon_unknown.dwarf_e58190::HandleWriteCommand;
        local_4b0 = 6;
        local_4a8 = "APPEND";
        local_4a0 = anon_unknown.dwarf_e58190::HandleAppendCommand;
        local_498 = 8;
        local_490 = "DOWNLOAD";
        local_488 = anon_unknown.dwarf_e58190::HandleDownloadCommand;
        local_480 = 6;
        local_478 = "UPLOAD";
        local_470 = anon_unknown.dwarf_e58190::HandleUploadCommand;
        local_468 = 4;
        local_460 = "READ";
        local_458 = anon_unknown.dwarf_e58190::HandleReadCommand;
        local_450 = 3;
        local_448 = "MD5";
        local_440 = anon_unknown.dwarf_e58190::HandleHashCommand;
        local_438 = 4;
        local_430 = "SHA1";
        local_428 = anon_unknown.dwarf_e58190::HandleHashCommand;
        local_420 = 6;
        local_418 = "SHA224";
        local_410 = anon_unknown.dwarf_e58190::HandleHashCommand;
        local_408 = 6;
        local_400 = "SHA256";
        local_3f8 = anon_unknown.dwarf_e58190::HandleHashCommand;
        local_3f0 = 6;
        local_3e8 = "SHA384";
        local_3e0 = anon_unknown.dwarf_e58190::HandleHashCommand;
        local_3d8 = 6;
        local_3d0 = "SHA512";
        local_3c8 = anon_unknown.dwarf_e58190::HandleHashCommand;
        local_3c0 = 8;
        local_3b8 = "SHA3_224";
        local_3b0 = anon_unknown.dwarf_e58190::HandleHashCommand;
        local_3a8 = 8;
        local_3a0 = "SHA3_256";
        local_398 = anon_unknown.dwarf_e58190::HandleHashCommand;
        local_390 = 8;
        local_388 = "SHA3_384";
        local_380 = anon_unknown.dwarf_e58190::HandleHashCommand;
        local_378 = 8;
        local_370 = "SHA3_512";
        local_368 = anon_unknown.dwarf_e58190::HandleHashCommand;
        local_360 = 7;
        local_358 = "STRINGS";
        local_350 = anon_unknown.dwarf_e58190::HandleStringsCommand;
        local_348 = 4;
        local_340 = "GLOB";
        local_338 = anon_unknown.dwarf_e58190::HandleGlobCommand;
        local_330 = 0xc;
        local_328 = "GLOB_RECURSE";
        local_320 = anon_unknown.dwarf_e58190::HandleGlobRecurseCommand;
        local_318 = 0xe;
        local_310 = "MAKE_DIRECTORY";
        local_308 = anon_unknown.dwarf_e58190::HandleMakeDirectoryCommand;
        local_300 = 6;
        local_2f8 = "RENAME";
        local_2f0 = anon_unknown.dwarf_e58190::HandleRename;
        local_2e8 = 9;
        local_2e0 = "COPY_FILE";
        local_2d8 = anon_unknown.dwarf_e58190::HandleCopyFile;
        local_2d0 = 6;
        local_2c8 = "REMOVE";
        local_2c0 = anon_unknown.dwarf_e58190::HandleRemove;
        local_2b8 = 0xe;
        local_2b0 = "REMOVE_RECURSE";
        local_2a8 = anon_unknown.dwarf_e58190::HandleRemoveRecurse;
        local_2a0 = 4;
        local_298 = "COPY";
        local_290 = anon_unknown.dwarf_e58190::HandleCopyCommand;
        local_288 = 7;
        local_280 = "INSTALL";
        local_278 = anon_unknown.dwarf_e58190::HandleInstallCommand;
        local_270 = 9;
        local_268 = "DIFFERENT";
        local_260 = anon_unknown.dwarf_e58190::HandleDifferentCommand;
        local_258 = 0xc;
        local_250 = "RPATH_CHANGE";
        local_248 = anon_unknown.dwarf_e58190::HandleRPathChangeCommand;
        local_240 = 7;
        local_238 = "CHRPATH";
        local_230 = anon_unknown.dwarf_e58190::HandleRPathChangeCommand;
        local_228 = 9;
        local_220 = "RPATH_SET";
        local_218 = anon_unknown.dwarf_e58190::HandleRPathSetCommand;
        local_210 = 0xb;
        local_208 = "RPATH_CHECK";
        local_200 = anon_unknown.dwarf_e58190::HandleRPathCheckCommand;
        local_1f8 = 0xc;
        local_1f0 = "RPATH_REMOVE";
        local_1e8 = anon_unknown.dwarf_e58190::HandleRPathRemoveCommand;
        local_1e0 = 8;
        local_1d8 = "READ_ELF";
        local_1d0 = anon_unknown.dwarf_e58190::HandleReadElfCommand;
        local_1c8 = 9;
        local_1c0 = "REAL_PATH";
        local_1b8 = anon_unknown.dwarf_e58190::HandleRealPathCommand;
        local_1b0 = 0xd;
        local_1a8 = "RELATIVE_PATH";
        local_1a0 = anon_unknown.dwarf_e58190::HandleRelativePathCommand;
        local_198 = 0xd;
        local_190 = "TO_CMAKE_PATH";
        local_188 = anon_unknown.dwarf_e58190::HandleCMakePathCommand;
        local_180 = 0xe;
        local_178 = "TO_NATIVE_PATH";
        local_170 = anon_unknown.dwarf_e58190::HandleNativePathCommand;
        local_168 = 5;
        local_160 = "TOUCH";
        local_158 = anon_unknown.dwarf_e58190::HandleTouchCommand;
        local_150 = 0xe;
        local_148 = "TOUCH_NOCREATE";
        local_140 = anon_unknown.dwarf_e58190::HandleTouchNocreateCommand;
        local_138 = 9;
        local_130 = "TIMESTAMP";
        local_128 = anon_unknown.dwarf_e58190::HandleTimestampCommand;
        local_120 = 8;
        local_118 = "GENERATE";
        local_110 = anon_unknown.dwarf_e58190::HandleGenerateCommand;
        local_108 = 4;
        local_100 = "LOCK";
        local_f8 = anon_unknown.dwarf_e58190::HandleLockCommand;
        local_f0 = 4;
        local_e8 = "SIZE";
        local_e0 = anon_unknown.dwarf_e58190::HandleSizeCommand;
        local_d8 = 0xc;
        local_d0 = "READ_SYMLINK";
        local_c8 = anon_unknown.dwarf_e58190::HandleReadSymlinkCommand;
        local_c0 = 0xb;
        local_b8 = "CREATE_LINK";
        local_b0 = anon_unknown.dwarf_e58190::HandleCreateLinkCommand;
        local_a8 = 0x18;
        local_a0 = "GET_RUNTIME_DEPENDENCIES";
        local_98 = anon_unknown.dwarf_e58190::HandleGetRuntimeDependenciesCommand;
        local_90 = 9;
        local_88 = "CONFIGURE";
        local_80 = anon_unknown.dwarf_e58190::HandleConfigureCommand;
        local_78 = 0xe;
        local_70 = "ARCHIVE_CREATE";
        local_68 = anon_unknown.dwarf_e58190::HandleArchiveCreateCommand;
        local_60 = 0xf;
        local_58 = "ARCHIVE_EXTRACT";
        local_50 = anon_unknown.dwarf_e58190::HandleArchiveExtractCommand;
        local_48 = 5;
        local_40 = "CHMOD";
        local_38 = anon_unknown.dwarf_e58190::HandleChmodCommand;
        local_30 = 0xd;
        local_28 = "CHMOD_RECURSE";
        local_20 = anon_unknown.dwarf_e58190::HandleChmodRecurseCommand;
        init._M_len = 0x32;
        init._M_array = &local_4c8;
        cmSubcommandTable::cmSubcommandTable(&cmFileCommand::subcommand,init);
        __cxa_atexit(cmSubcommandTable::~cmSubcommandTable,&cmFileCommand::subcommand,&__dso_handle)
        ;
        __cxa_guard_release(&cmFileCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::subcommand);
      }
    }
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    key._M_str = (pbVar1->_M_dataplus)._M_p;
    key._M_len = pbVar1->_M_string_length;
    bVar2 = cmSubcommandTable::operator()(&cmFileCommand::subcommand,key,args,status);
  }
  return bVar2;
}

Assistant:

bool cmFileCommand(std::vector<std::string> const& args,
                   cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("must be called with at least two arguments.");
    return false;
  }

  static cmSubcommandTable const subcommand{
    { "WRITE"_s, HandleWriteCommand },
    { "APPEND"_s, HandleAppendCommand },
    { "DOWNLOAD"_s, HandleDownloadCommand },
    { "UPLOAD"_s, HandleUploadCommand },
    { "READ"_s, HandleReadCommand },
    { "MD5"_s, HandleHashCommand },
    { "SHA1"_s, HandleHashCommand },
    { "SHA224"_s, HandleHashCommand },
    { "SHA256"_s, HandleHashCommand },
    { "SHA384"_s, HandleHashCommand },
    { "SHA512"_s, HandleHashCommand },
    { "SHA3_224"_s, HandleHashCommand },
    { "SHA3_256"_s, HandleHashCommand },
    { "SHA3_384"_s, HandleHashCommand },
    { "SHA3_512"_s, HandleHashCommand },
    { "STRINGS"_s, HandleStringsCommand },
    { "GLOB"_s, HandleGlobCommand },
    { "GLOB_RECURSE"_s, HandleGlobRecurseCommand },
    { "MAKE_DIRECTORY"_s, HandleMakeDirectoryCommand },
    { "RENAME"_s, HandleRename },
    { "COPY_FILE"_s, HandleCopyFile },
    { "REMOVE"_s, HandleRemove },
    { "REMOVE_RECURSE"_s, HandleRemoveRecurse },
    { "COPY"_s, HandleCopyCommand },
    { "INSTALL"_s, HandleInstallCommand },
    { "DIFFERENT"_s, HandleDifferentCommand },
    { "RPATH_CHANGE"_s, HandleRPathChangeCommand },
    { "CHRPATH"_s, HandleRPathChangeCommand },
    { "RPATH_SET"_s, HandleRPathSetCommand },
    { "RPATH_CHECK"_s, HandleRPathCheckCommand },
    { "RPATH_REMOVE"_s, HandleRPathRemoveCommand },
    { "READ_ELF"_s, HandleReadElfCommand },
    { "REAL_PATH"_s, HandleRealPathCommand },
    { "RELATIVE_PATH"_s, HandleRelativePathCommand },
    { "TO_CMAKE_PATH"_s, HandleCMakePathCommand },
    { "TO_NATIVE_PATH"_s, HandleNativePathCommand },
    { "TOUCH"_s, HandleTouchCommand },
    { "TOUCH_NOCREATE"_s, HandleTouchNocreateCommand },
    { "TIMESTAMP"_s, HandleTimestampCommand },
    { "GENERATE"_s, HandleGenerateCommand },
    { "LOCK"_s, HandleLockCommand },
    { "SIZE"_s, HandleSizeCommand },
    { "READ_SYMLINK"_s, HandleReadSymlinkCommand },
    { "CREATE_LINK"_s, HandleCreateLinkCommand },
    { "GET_RUNTIME_DEPENDENCIES"_s, HandleGetRuntimeDependenciesCommand },
    { "CONFIGURE"_s, HandleConfigureCommand },
    { "ARCHIVE_CREATE"_s, HandleArchiveCreateCommand },
    { "ARCHIVE_EXTRACT"_s, HandleArchiveExtractCommand },
    { "CHMOD"_s, HandleChmodCommand },
    { "CHMOD_RECURSE"_s, HandleChmodRecurseCommand },
  };

  return subcommand(args[0], args, status);
}